

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void PreVisitWith(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  ArenaAllocator *alloc;
  Scope *this;
  FuncInfo *pFVar1;
  ParseNodeWith *pPVar2;
  
  alloc = byteCodeGenerator->alloc;
  this = (Scope *)new<Memory::ArenaAllocator>(0x48,alloc,0x35916e);
  Scope::Scope(this,alloc,ScopeType_With,0);
  pFVar1 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  this->func = pFVar1;
  this->field_0x44 = this->field_0x44 | 1;
  pPVar2 = ParseNode::AsParseNodeWith(pnode);
  pPVar2->scope = this;
  ByteCodeGenerator::PushScope(byteCodeGenerator,this);
  return;
}

Assistant:

void PreVisitWith(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
    Scope *scope = Anew(alloc, Scope, alloc, ScopeType_With);
    scope->SetFunc(byteCodeGenerator->TopFuncInfo());
    scope->SetIsDynamic(true);
    pnode->AsParseNodeWith()->scope = scope;

    byteCodeGenerator->PushScope(scope);
}